

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O2

wchar_t archive_read_format_lha_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  long *plVar1;
  lzh_br *br;
  lzh_stream *strm;
  char cVar2;
  int64_t *piVar3;
  long *plVar4;
  int *piVar5;
  uint64_t uVar6;
  long lVar7;
  uint16_t uVar8;
  wchar_t wVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  wchar_t wVar13;
  uint uVar14;
  wchar_t wVar15;
  void *pvVar16;
  undefined4 *puVar17;
  long lVar18;
  int iVar19;
  ulong uVar20;
  long lVar21;
  wchar_t tbl_bits;
  wchar_t tbl_bits_00;
  char *fmt;
  byte bVar22;
  int iVar23;
  long lVar24;
  ulong uVar25;
  int *piVar26;
  void *__src;
  int iVar27;
  byte bVar28;
  wchar_t wVar29;
  size_t len;
  wchar_t wVar30;
  lzh_br local_b8;
  huffman_conflict *local_a0;
  int *local_98;
  int *local_90;
  huffman_conflict *local_88;
  ulong local_80;
  int *local_78;
  int *local_70;
  size_t *local_68;
  long local_60;
  int *local_58;
  long local_50;
  huffman_conflict *local_48;
  long local_40;
  long local_38;
  
  piVar3 = (int64_t *)a->format->data;
  if (piVar3[2] != 0) {
    __archive_read_consume(a,piVar3[2]);
    piVar3[2] = 0;
  }
  if (*(char *)((long)piVar3 + 0x124) != '\0') {
    *offset = *piVar3;
    *size = 0;
    *buff = (void *)0x0;
    wVar9 = lha_end_of_entry(a);
    return wVar9;
  }
  plVar4 = (long *)a->format->data;
  if (*(char *)((long)piVar3 + 0x126) == '\0') {
    if (plVar4[1] == 0) {
      *buff = (void *)0x0;
      *size = 0;
      *offset = *plVar4;
      *(undefined1 *)((long)plVar4 + 0x124) = 1;
      return L'\0';
    }
    pvVar16 = __archive_read_ahead(a,1,(ssize_t *)&local_b8);
    *buff = pvVar16;
    if (0 < (long)local_b8.cache_buffer) {
      if (plVar4[1] < (long)local_b8.cache_buffer) {
        local_b8.cache_buffer = plVar4[1];
      }
      uVar6 = local_b8.cache_buffer;
      uVar8 = lha_crc16(*(uint16_t *)(plVar4 + 3),pvVar16,local_b8.cache_buffer);
      *(uint16_t *)(plVar4 + 3) = uVar8;
      *size = uVar6;
      lVar21 = *plVar4;
      *offset = lVar21;
      *plVar4 = lVar21 + uVar6;
      plVar1 = plVar4 + 1;
      *plVar1 = *plVar1 - uVar6;
      if (*plVar1 == 0) {
        *(undefined1 *)((long)plVar4 + 0x124) = 1;
      }
      plVar4[2] = uVar6;
      return L'\0';
    }
    fmt = "Truncated LHa file data";
  }
  else {
    local_68 = size;
    if (*(char *)((long)plVar4 + 0x123) == '\0') {
      puVar17 = (undefined4 *)plVar4[0x33];
      if (puVar17 == (undefined4 *)0x0) {
        puVar17 = (undefined4 *)calloc(1,0x158);
        plVar4[0x33] = (long)puVar17;
        if (puVar17 != (undefined4 *)0x0) goto LAB_00125d0a;
      }
      else {
LAB_00125d0a:
        puVar17[0x55] = 0xffffffe7;
        if ((*(char *)((long)plVar4 + 0x29) != 'l') || (*(char *)((long)plVar4 + 0x2a) != 'h')) {
LAB_00125d5e:
          *buff = (void *)0x0;
          *local_68 = 0;
          *offset = 0;
          archive_set_error(&a->archive,0x54,"Unsupported lzh compression method -%c%c%c-",
                            (ulong)(uint)(int)*(char *)((long)plVar4 + 0x29),
                            (ulong)(uint)(int)*(char *)((long)plVar4 + 0x2a),
                            (ulong)(uint)(int)*(char *)((long)plVar4 + 0x2b));
          archive_read_format_lha_read_data_skip(a);
          return L'\xffffffec';
        }
        cVar2 = *(char *)((long)plVar4 + 0x2b);
        if (cVar2 == '5') {
          bVar22 = 0;
          iVar23 = 0xd;
LAB_00126b0d:
          bVar28 = 0;
        }
        else {
          if (cVar2 != '7') {
            if (cVar2 != '6') goto LAB_00125d5e;
            iVar23 = 0xf;
            bVar22 = 1;
            goto LAB_00126b0d;
          }
          iVar23 = 0x10;
          bVar28 = 1;
          bVar22 = 0;
        }
        puVar17[0x55] = 0xffffffe2;
        *(undefined8 *)(puVar17 + 1) = 0x1ffff00020000;
        pvVar16 = *(void **)(puVar17 + 4);
        if (pvVar16 == (void *)0x0) {
          pvVar16 = malloc(0x20000);
          *(void **)(puVar17 + 4) = pvVar16;
          if (pvVar16 == (void *)0x0) goto LAB_00126bd0;
        }
        uVar20 = (ulong)(uint)(1 << (sbyte)iVar23);
        memset((void *)((long)pvVar16 + (0x20000 - uVar20)),0x20,uVar20);
        puVar17[6] = 0;
        *puVar17 = 0;
        puVar17[0x4f] = iVar23 + 1;
        puVar17[0x50] = (bVar22 | bVar28) | 4;
        *(undefined8 *)(puVar17 + 0x51) = 0x500000013;
        *(undefined8 *)(puVar17 + 10) = 0;
        puVar17[0xc] = 0;
        wVar9 = lzh_huffman_init((huffman_conflict *)(puVar17 + 0xe),0x1fe,tbl_bits);
        if (wVar9 == L'\0') {
          puVar17[0x10] = 9;
          wVar9 = lzh_huffman_init((huffman_conflict *)(puVar17 + 0x2e),0x13,tbl_bits_00);
          if (wVar9 == L'\0') {
            puVar17[0x55] = 0;
            *(undefined1 *)((long)plVar4 + 0x123) = 1;
            *(undefined4 *)(plVar4 + 0x31) = 0;
            plVar4[0x32] = 0;
            goto LAB_00125be8;
          }
        }
      }
LAB_00126bd0:
      fmt = "Couldn\'t allocate memory for lzh decompression";
      iVar23 = 0xc;
      goto LAB_00126bdf;
    }
LAB_00125be8:
    pvVar16 = __archive_read_ahead(a,1,&local_38);
    plVar4[0x2d] = (long)pvVar16;
    if (0 < local_38) {
      lVar21 = plVar4[1];
      if (lVar21 < local_38) {
        local_38 = lVar21;
      }
      lVar7 = local_38;
      iVar10 = (int)local_38;
      *(int *)(plVar4 + 0x2e) = iVar10;
      plVar4[0x2f] = 0;
      *(undefined4 *)(plVar4 + 0x31) = 0;
      piVar26 = (int *)plVar4[0x33];
      iVar23 = piVar26[0x55];
      if (iVar23 == 0) {
        strm = (lzh_stream *)(plVar4 + 0x2d);
        local_98 = piVar26;
LAB_00125de7:
        piVar5 = (int *)plVar4[0x33];
        local_88 = (huffman_conflict *)(piVar5 + 0x2e);
        if (8 < *piVar26) {
          local_58 = piVar5 + 10;
          local_b8.cache_buffer = *(uint64_t *)(piVar5 + 10);
          local_b8.cache_avail = piVar5[0xc];
          local_b8._12_4_ = piVar5[0xd];
          local_48 = (huffman_conflict *)(piVar5 + 0xe);
          lVar24 = *(long *)(piVar5 + 4);
          local_50 = *(long *)(piVar5 + 0x22);
          local_60 = *(long *)(piVar5 + 0x42);
          local_a0 = (huffman_conflict *)CONCAT44(local_a0._4_4_,piVar5[0x4e]);
          iVar23 = piVar5[8];
          wVar9 = piVar5[7];
          uVar20 = (ulong)(uint)piVar5[6];
          local_80 = CONCAT44(local_80._4_4_,piVar5[2]);
          iVar19 = *piVar5;
          wVar13 = piVar5[1];
          local_70 = (int *)(long)piVar5[0x24];
          local_40 = (long)piVar5[0x44];
          local_78 = (int *)(long)wVar13;
          local_90 = piVar5;
switchD_001264fc_default:
          do {
            switch(iVar19) {
            case 9:
              uVar20 = (ulong)(int)uVar20;
              iVar23 = -(uint)local_a0;
              do {
                local_a0 = (huffman_conflict *)CONCAT44(local_a0._4_4_,iVar23);
                if (iVar23 == 0) {
                  *local_90 = 0;
                  *local_58 = (int)local_b8.cache_buffer;
                  local_58[1] = local_b8.cache_buffer._4_4_;
                  local_58[2] = local_b8.cache_avail;
                  local_58[3] = local_b8._12_4_;
                  local_90[0x4e] = 0;
                  local_90[6] = (int)uVar20;
                  local_90[7] = 0;
                  iVar23 = 100;
                  goto LAB_00126963;
                }
                wVar30 = local_b8.cache_avail;
                if (local_b8.cache_avail < (wchar_t)local_70) {
                  wVar9 = lzh_br_fillup(strm,&local_b8);
                  wVar30 = local_b8.cache_avail;
                  if ((wVar9 != L'\0') || ((wchar_t)local_70 <= local_b8.cache_avail))
                  goto LAB_001265c1;
                  if (lVar7 != lVar21) {
                    local_a0 = (huffman_conflict *)CONCAT44(local_a0._4_4_,-(uint)local_a0);
                    iVar23 = 9;
                    goto LAB_0012697d;
                  }
                  wVar9 = lzh_decode_huffman(local_48,(uint)cache_masks[(long)local_70] &
                                                      (uint)(local_b8.cache_buffer <<
                                                            ((char)local_70 -
                                                             (char)local_b8.cache_avail & 0x3fU)));
                  wVar30 = wVar30 - (uint)*(byte *)(local_50 + (ulong)(uint)wVar9);
                  local_b8.cache_avail = wVar30;
                  if (wVar30 < L'\0') goto LAB_00126995;
                }
                else {
LAB_001265c1:
                  wVar9 = lzh_decode_huffman(local_48,(uint)cache_masks[(long)local_70] &
                                                      (uint)(local_b8.cache_buffer >>
                                                            ((char)wVar30 - (char)local_70 & 0x3fU))
                                            );
                  wVar30 = wVar30 - (uint)*(byte *)(local_50 + (ulong)(uint)wVar9);
                  local_b8.cache_avail = wVar30;
                }
                if (0xff < (uint)wVar9) goto LAB_0012663b;
                *(char *)(lVar24 + uVar20) = (char)wVar9;
                uVar20 = uVar20 + 1;
                iVar23 = (uint)local_a0 + 1;
                piVar26 = local_98;
                if ((long)local_78 <= (long)uVar20) {
                  plVar4[0x30] = *(long *)(plVar4[0x33] + 0x10);
                  *(int *)(plVar4 + 0x31) = (int)local_78;
                  plVar4[0x32] = plVar4[0x32] + (long)local_78;
                  local_a0 = (huffman_conflict *)CONCAT44(local_a0._4_4_,-iVar23);
                  goto LAB_00126932;
                }
              } while( true );
            case 10:
              wVar30 = local_b8.cache_avail;
              goto LAB_00126646;
            case 0xb:
              goto switchD_001264fc_caseD_b;
            case 0xc:
              goto switchD_001264fc_caseD_c;
            }
          } while( true );
        }
        br = (lzh_br *)(piVar5 + 10);
        local_70 = piVar5 + 0x31;
        local_a0 = (huffman_conflict *)(piVar5 + 0xe);
        local_78 = piVar5 + 0x11;
        iVar23 = *piVar5;
switchD_00125e4c_default:
        switch(iVar23) {
        case 0:
          iVar23 = piVar5[0xc];
          if (iVar23 < 0x10) {
            wVar9 = lzh_br_fillup(strm,br);
            if (wVar9 != L'\0') {
              iVar23 = piVar5[0xc];
              goto LAB_00125e72;
            }
            iVar23 = 0;
            if (lVar7 != lVar21) goto LAB_00126a41;
            if (piVar5[0xc] < 8) {
              iVar23 = piVar5[6];
              if ((long)iVar23 < 1) {
                iVar23 = 1;
              }
              else {
                plVar4[0x30] = *(long *)(plVar4[0x33] + 0x10);
                *(int *)(plVar4 + 0x31) = iVar23;
                plVar4[0x32] = plVar4[0x32] + (long)iVar23;
                piVar5[6] = 0;
                iVar23 = 0;
              }
              goto LAB_00126a41;
            }
          }
          else {
LAB_00125e72:
            iVar23 = iVar23 + -0x10;
            uVar20 = *(ulong *)(piVar5 + 10) >> ((byte)iVar23 & 0x3f);
            piVar5[0x4e] = (uint)uVar20 & 0xffff;
            if ((uVar20 & 0xffff) != 0) {
              piVar5[0xc] = iVar23;
              iVar19 = piVar5[0x52];
              piVar5[0x2e] = piVar5[0x51];
              piVar5[0x30] = iVar19;
              piVar5[0x53] = 0;
              goto LAB_00125ecc;
            }
          }
          break;
        case 1:
          iVar23 = piVar5[0xc];
          iVar19 = piVar5[0x30];
LAB_00125ecc:
          if (iVar19 <= iVar23) {
LAB_00125f02:
            wVar9 = (uint)cache_masks[iVar19] &
                    (uint)(*(ulong *)(piVar5 + 10) >> ((byte)(iVar23 - iVar19) & 0x3f));
            piVar5[0x2f] = wVar9;
            piVar5[0xc] = iVar23 - iVar19;
            goto LAB_00125f25;
          }
          wVar9 = lzh_br_fillup(strm,br);
          iVar23 = piVar5[0xc];
          iVar19 = piVar5[0x30];
          if (iVar19 <= iVar23 || wVar9 != L'\0') goto LAB_00125f02;
          if (lVar7 == lVar21) break;
          *piVar5 = 1;
          goto LAB_00126a2b;
        case 2:
          wVar9 = piVar5[0x2f];
LAB_00125f25:
          if (wVar9 == L'\0') {
            iVar23 = piVar5[0xc];
            iVar19 = piVar5[0x30];
            if (iVar23 < iVar19) {
              wVar9 = lzh_br_fillup(strm,br);
              iVar23 = piVar5[0xc];
              iVar19 = piVar5[0x30];
              if (iVar23 < iVar19 && wVar9 == L'\0') {
                if (lVar7 != lVar21) {
                  *piVar5 = 2;
                  goto LAB_00126a2b;
                }
                break;
              }
            }
            wVar9 = lzh_make_fake_table(local_88,(ushort)(br->cache_buffer >>
                                                         ((char)iVar23 - (char)iVar19 & 0x3fU)) &
                                                 cache_masks[iVar19]);
            if (wVar9 != L'\0') {
              piVar5[0xc] = piVar5[0xc] - piVar5[0x30];
              iVar23 = (uint)(piVar5[0x53] != 0) * 4 + 5;
              goto LAB_00126438;
            }
            break;
          }
          wVar13 = local_88->len_size;
          if (wVar13 < wVar9) break;
          piVar5[0x54] = 0;
          local_70[0xc] = 0;
          local_70[0xd] = 0;
          local_70[0xe] = 0;
          local_70[0xf] = 0;
          local_70[8] = 0;
          local_70[9] = 0;
          local_70[10] = 0;
          local_70[0xb] = 0;
          local_70[0x10] = 0;
          local_70[4] = 0;
          local_70[5] = 0;
          local_70[6] = 0;
          local_70[7] = 0;
          local_70[0] = 0;
          local_70[1] = 0;
          local_70[2] = 0;
          local_70[3] = 0;
          iVar23 = 4;
          if ((L'\x02' < wVar9) && (wVar9 = L'\0', wVar13 != piVar5[0x4f])) goto LAB_00126028;
          goto LAB_00126438;
        case 3:
          wVar9 = piVar5[0x54];
LAB_00126028:
          wVar9 = lzh_read_pt_bitlen(strm,wVar9,L'\x03');
          piVar5[0x54] = wVar9;
          if (wVar9 < L'\x03') {
            if ((lVar7 != lVar21) && (L'\xffffffff' < wVar9)) {
LAB_00126cbc:
              *piVar5 = 3;
              goto LAB_00126a2b;
            }
          }
          else {
            iVar23 = piVar5[0xc];
            if (iVar23 < 2) {
              wVar9 = lzh_br_fillup(strm,br);
              iVar23 = piVar5[0xc];
              if (iVar23 < 2 && wVar9 == L'\0') {
                if (lVar7 != lVar21) goto LAB_00126cbc;
                break;
              }
            }
            uVar11 = (uint)(*(ulong *)(piVar5 + 10) >> ((byte)(iVar23 + -2) & 0x3f));
            uVar14 = uVar11 & 3;
            piVar5[0xc] = iVar23 + -2;
            if ((int)uVar14 <= piVar5[0x2f] + -3) {
              wVar9 = uVar14 + L'\x03';
              for (uVar20 = 0; (uVar11 & 3) != uVar20; uVar20 = uVar20 + 1) {
                *(undefined1 *)(*(long *)(piVar5 + 0x42) + 3 + uVar20) = 0;
              }
              piVar5[0x54] = wVar9;
              goto LAB_001260c7;
            }
          }
          break;
        case 4:
          wVar9 = piVar5[0x54];
LAB_001260c7:
          wVar9 = lzh_read_pt_bitlen(strm,wVar9,piVar5[0x2f]);
          piVar5[0x54] = wVar9;
          if (wVar9 < piVar5[0x2f]) {
            if ((lVar7 != lVar21) && (L'\xffffffff' < wVar9)) {
              *piVar5 = 4;
              goto LAB_00126a2b;
            }
          }
          else {
            wVar9 = lzh_make_huffman_table(local_88);
            if (wVar9 != L'\0') {
              iVar23 = 9;
              if (piVar5[0x53] != 0) goto LAB_00126438;
              goto switchD_00125e4c_caseD_5;
            }
          }
          break;
        case 5:
switchD_00125e4c_caseD_5:
          iVar23 = piVar5[0xc];
          iVar19 = piVar5[0x10];
          if (iVar23 < iVar19) {
            wVar9 = lzh_br_fillup(strm,br);
            iVar23 = piVar5[0xc];
            iVar19 = piVar5[0x10];
            if (iVar23 < iVar19 && wVar9 == L'\0') {
              if (lVar7 != lVar21) {
                *piVar5 = 5;
                goto LAB_00126a2b;
              }
              break;
            }
          }
          wVar9 = (uint)cache_masks[iVar19] &
                  (uint)(*(ulong *)(piVar5 + 10) >> ((byte)(iVar23 - iVar19) & 0x3f));
          piVar5[0xf] = wVar9;
          piVar5[0xc] = iVar23 - iVar19;
          goto LAB_0012616d;
        case 6:
          wVar9 = piVar5[0xf];
LAB_0012616d:
          if (wVar9 != L'\0') {
            if (wVar9 <= local_a0->len_size) {
              piVar5[0x54] = 0;
              local_78[0xc] = 0;
              local_78[0xd] = 0;
              local_78[0xe] = 0;
              local_78[0xf] = 0;
              local_78[8] = 0;
              local_78[9] = 0;
              local_78[10] = 0;
              local_78[0xb] = 0;
              local_78[4] = 0;
              local_78[5] = 0;
              local_78[6] = 0;
              local_78[7] = 0;
              local_78[0] = 0;
              local_78[1] = 0;
              local_78[2] = 0;
              local_78[3] = 0;
              local_78[0x10] = 0;
              iVar23 = 0;
LAB_0012622b:
              while (iVar23 < piVar5[0xf]) {
                iVar19 = piVar5[0xc];
                iVar12 = piVar5[0x44];
                if (iVar19 < iVar12) {
                  wVar9 = lzh_br_fillup(strm,br);
                  iVar19 = piVar5[0xc];
                  iVar12 = piVar5[0x44];
                  if (iVar12 <= iVar19 || wVar9 != L'\0') goto LAB_00126275;
LAB_00126a00:
                  if (lVar7 == lVar21) goto LAB_00126a0c;
                  piVar5[0x54] = iVar23;
                  *piVar5 = 7;
                  goto LAB_00126a2b;
                }
LAB_00126275:
                wVar9 = lzh_decode_huffman(local_88,(uint)cache_masks[iVar12] &
                                                    (uint)(br->cache_buffer >>
                                                          ((char)iVar19 - (char)iVar12 & 0x3fU)));
                uVar20 = (ulong)(uint)wVar9;
                lVar24 = (long)iVar23;
                if ((uint)wVar9 < 3) {
                  if (wVar9 == L'\0') {
                    piVar5[0xc] = iVar19 - (uint)**(byte **)(piVar5 + 0x42);
                    iVar23 = iVar23 + 1;
                    *(undefined1 *)(*(long *)(piVar5 + 0x22) + lVar24) = 0;
                  }
                  else {
                    uVar11 = (uint)(wVar9 != L'\x01');
                    uVar25 = (ulong)uVar11 * 5 + 4;
                    uVar14 = (uint)*(byte *)(*(long *)(piVar5 + 0x42) + uVar20);
                    if (iVar19 < (int)(uVar11 * 5 +
                                       (uint)*(byte *)(*(long *)(piVar5 + 0x42) + uVar20) + 4)) {
                      local_80 = uVar25;
                      wVar13 = lzh_br_fillup(strm,br);
                      uVar25 = local_80;
                      if (wVar13 == L'\0') {
                        iVar19 = piVar5[0xc];
                        bVar22 = *(byte *)(*(long *)(piVar5 + 0x42) + uVar20);
                        uVar14 = (uint)bVar22;
                        if (iVar19 < (int)((int)local_80 + (uint)bVar22)) goto LAB_00126a00;
                      }
                      else {
                        uVar14 = (uint)*(byte *)(*(long *)(piVar5 + 0x42) + uVar20);
                        iVar19 = piVar5[0xc];
                      }
                    }
                    iVar19 = (((uint)(wVar9 == L'\x01') * 5 + -9) - uVar14) + iVar19;
                    uVar14 = (uint)cache_masks[uVar25 & 0xffffffff] &
                             (uint)(*(ulong *)(piVar5 + 10) >> ((byte)iVar19 & 0x3f));
                    uVar11 = uVar14 + 3;
                    if (wVar9 != L'\x01') {
                      uVar11 = uVar14 + 0x14;
                    }
                    piVar5[0xc] = iVar19;
                    iVar23 = iVar23 + uVar11;
                    if (piVar5[0xf] < iVar23) goto LAB_00126a0c;
                    memset((void *)(lVar24 + *(long *)(piVar5 + 0x22)),0,(ulong)uVar11);
                  }
                }
                else {
                  piVar5[0xc] = iVar19 - (uint)*(byte *)(*(long *)(piVar5 + 0x42) + uVar20);
                  piVar5[(ulong)(uint)(wVar9 + L'\xfffffffe') + 0x11] =
                       piVar5[(ulong)(uint)(wVar9 + L'\xfffffffe') + 0x11] + 1;
                  iVar23 = iVar23 + 1;
                  *(char *)(*(long *)(piVar5 + 0x22) + lVar24) = (char)(wVar9 + L'\xfffffffe');
                }
              }
              if ((iVar23 <= piVar5[0xf]) &&
                 (wVar9 = lzh_make_huffman_table(local_a0), wVar9 != L'\0')) {
switchD_00125e4c_caseD_8:
                piVar5[0x2e] = piVar5[0x4f];
                piVar5[0x30] = piVar5[0x50];
                piVar5[0x53] = 1;
                iVar23 = 1;
                goto LAB_00126438;
              }
            }
            break;
          }
          iVar23 = piVar5[0xc];
          iVar19 = piVar5[0x10];
          if (iVar23 < iVar19) {
            wVar9 = lzh_br_fillup(strm,br);
            iVar23 = piVar5[0xc];
            iVar19 = piVar5[0x10];
            if (iVar23 < iVar19 && wVar9 == L'\0') {
              if (lVar7 == lVar21) break;
              *piVar5 = 6;
LAB_00126a2b:
              iVar23 = 0;
              goto LAB_00126a41;
            }
          }
          wVar9 = lzh_make_fake_table(local_a0,(ushort)(br->cache_buffer >>
                                                       ((char)iVar23 - (char)iVar19 & 0x3fU)) &
                                               cache_masks[iVar19]);
          if (wVar9 == L'\0') break;
          piVar5[0xc] = piVar5[0xc] - piVar5[0x10];
          iVar23 = 8;
LAB_00126438:
          *piVar5 = iVar23;
          goto switchD_00125e4c_default;
        case 7:
          iVar23 = piVar5[0x54];
          goto LAB_0012622b;
        case 8:
          goto switchD_00125e4c_caseD_8;
        case 9:
          goto switchD_00125e4c_caseD_9;
        default:
          goto switchD_00125e4c_default;
        }
LAB_00126a0c:
        piVar5[0x55] = -0x19;
        iVar23 = -0x19;
        goto LAB_00126a41;
      }
      lVar21 = 0;
LAB_00126a5e:
      if (iVar23 != 0) {
        if (iVar23 != 1) {
          archive_set_error(&a->archive,-1,"Bad lzh data");
          return L'\xffffffe7';
        }
        *(undefined1 *)((long)plVar4 + 0x124) = 1;
      }
      plVar4[2] = lVar21;
      plVar4[1] = plVar4[1] - lVar21;
      len = (size_t)(int)plVar4[0x31];
      *offset = *plVar4;
      if (len == 0) {
        *local_68 = 0;
        *buff = (void *)0x0;
        if (*(char *)((long)plVar4 + 0x124) != '\0') {
          wVar9 = lha_end_of_entry(a);
          return wVar9;
        }
      }
      else {
        *local_68 = len;
        pvVar16 = (void *)plVar4[0x30];
        *buff = pvVar16;
        uVar8 = lha_crc16(*(uint16_t *)(plVar4 + 3),pvVar16,len);
        *(uint16_t *)(plVar4 + 3) = uVar8;
        *plVar4 = *plVar4 + len;
      }
      return L'\0';
    }
    fmt = "Truncated LHa file body";
  }
  iVar23 = 0x54;
LAB_00126bdf:
  archive_set_error(&a->archive,iVar23,fmt);
  return L'\xffffffe2';
LAB_0012663b:
  iVar23 = wVar9 + L'\xffffff03';
  local_a0 = (huffman_conflict *)CONCAT44(local_a0._4_4_,~(uint)local_a0);
LAB_00126646:
  lVar18 = local_40;
  wVar9 = (wchar_t)local_40;
  cVar2 = (char)local_40;
  if (wVar30 < wVar9) {
    wVar15 = lzh_br_fillup(strm,&local_b8);
    wVar30 = local_b8.cache_avail;
    if ((wVar15 != L'\0') || (wVar9 <= local_b8.cache_avail)) goto LAB_001266d2;
    if (lVar7 != lVar21) {
      local_90[8] = iVar23;
      iVar23 = 10;
LAB_0012697d:
      iVar19 = (int)uVar20;
LAB_00126941:
      *local_58 = (int)local_b8.cache_buffer;
      local_58[1] = local_b8.cache_buffer._4_4_;
      local_58[2] = local_b8.cache_avail;
      local_58[3] = local_b8._12_4_;
      local_90[0x4e] = (uint)local_a0;
      *local_90 = iVar23;
      local_90[6] = iVar19;
      iVar23 = 0;
      piVar26 = local_98;
      goto LAB_00126963;
    }
    wVar9 = lzh_decode_huffman(local_88,(uint)cache_masks[lVar18] &
                                        (uint)(local_b8.cache_buffer <<
                                              (cVar2 - (char)local_b8.cache_avail & 0x3fU)));
    wVar30 = wVar30 - (uint)*(byte *)(local_60 + (ulong)(uint)wVar9);
    local_b8.cache_avail = wVar30;
    if (wVar30 < L'\0') goto LAB_00126995;
  }
  else {
LAB_001266d2:
    wVar9 = lzh_decode_huffman(local_88,(uint)cache_masks[lVar18] &
                                        (uint)(local_b8.cache_buffer >>
                                              ((char)wVar30 - cVar2 & 0x3fU)));
    local_b8.cache_avail = wVar30 - (uint)*(byte *)(local_60 + (ulong)(uint)wVar9);
  }
switchD_001264fc_caseD_b:
  iVar19 = (int)uVar20;
  if (L'\x01' < wVar9) {
    wVar30 = wVar9 + L'\xffffffff';
    if (local_b8.cache_avail < wVar30) {
      wVar15 = lzh_br_fillup(strm,&local_b8);
      if ((wVar15 == L'\0') && (local_b8.cache_avail < wVar30)) {
        if (lVar7 != lVar21) {
          local_90[8] = iVar23;
          local_90[7] = wVar9;
          iVar23 = 0xb;
          goto LAB_00126941;
        }
LAB_00126995:
        local_90[0x55] = -0x19;
        iVar23 = -0x19;
        piVar26 = local_98;
        goto LAB_00126963;
      }
    }
    wVar9 = ((uint)cache_masks[(uint)wVar30] &
            (uint)(local_b8.cache_buffer >> ((byte)(local_b8.cache_avail - wVar30) & 0x3f))) +
            (1 << ((byte)wVar30 & 0x1f));
    local_b8.cache_avail = local_b8.cache_avail - wVar30;
  }
  wVar9 = ~wVar9 + iVar19 & (uint)local_80;
switchD_001264fc_caseD_c:
  do {
    wVar15 = (wchar_t)uVar20;
    wVar30 = wVar15;
    if (wVar15 < wVar9) {
      wVar30 = wVar9;
    }
    iVar27 = wVar13 - wVar30;
    iVar12 = iVar27;
    if (iVar23 < iVar27) {
      iVar12 = iVar23;
    }
    wVar30 = iVar12 + wVar9;
    wVar29 = wVar15 + iVar12;
    uVar20 = (ulong)(uint)wVar29;
    pvVar16 = (void *)(lVar24 + wVar15);
    __src = (void *)(wVar9 + lVar24);
    if ((wVar30 < wVar15) || (wVar29 < wVar9)) {
      memcpy(pvVar16,__src,(long)iVar12);
    }
    else {
      for (lVar18 = 0; lVar18 < iVar12 + -1; lVar18 = lVar18 + 2) {
        *(undefined1 *)((long)pvVar16 + lVar18) = *(undefined1 *)((long)__src + lVar18);
        *(undefined1 *)((long)pvVar16 + lVar18 + 1) = *(undefined1 *)((long)__src + lVar18 + 1);
      }
      if ((int)lVar18 < iVar12) {
        *(undefined1 *)((long)pvVar16 + lVar18) = *(undefined1 *)((long)__src + lVar18);
      }
    }
    if (wVar29 == wVar13) {
      plVar4[0x30] = *(long *)(plVar4[0x33] + 0x10);
      *(wchar_t *)(plVar4 + 0x31) = wVar13;
      plVar4[0x32] = plVar4[0x32] + (long)local_78;
      iVar19 = 0;
      if (iVar27 < iVar23) {
        local_90[8] = iVar23 - iVar12;
        local_90[7] = wVar30 & (uint)local_80;
        iVar23 = 0xc;
      }
      else {
LAB_00126932:
        iVar23 = 9;
        iVar19 = 0;
      }
      goto LAB_00126941;
    }
    if (iVar23 <= iVar27) break;
    iVar23 = iVar23 - iVar12;
    wVar9 = wVar30 & (uint)local_80;
  } while( true );
  iVar19 = 9;
  piVar26 = local_98;
  goto switchD_001264fc_default;
switchD_00125e4c_caseD_9:
  iVar23 = 100;
  piVar26 = local_98;
LAB_00126963:
  if (iVar23 != 100) goto LAB_00126a41;
  goto LAB_00125de7;
LAB_00126a41:
  lVar21 = ((long)iVar10 - (long)(int)plVar4[0x2e]) + plVar4[0x2f];
  plVar4[0x2f] = lVar21;
  goto LAB_00126a5e;
}

Assistant:

static int
archive_read_format_lha_read_data(struct archive_read *a,
    const void **buff, size_t *size, int64_t *offset)
{
	struct lha *lha = (struct lha *)(a->format->data);
	int r;

	if (lha->entry_unconsumed) {
		/* Consume as much as the decompressor actually used. */
		__archive_read_consume(a, lha->entry_unconsumed);
		lha->entry_unconsumed = 0;
	}
	if (lha->end_of_entry) {
		*offset = lha->entry_offset;
		*size = 0;
		*buff = NULL;
		return (lha_end_of_entry(a));
	}

	if (lha->entry_is_compressed)
		r =  lha_read_data_lzh(a, buff, size, offset);
	else
		/* No compression. */
		r =  lha_read_data_none(a, buff, size, offset);
	return (r);
}